

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::getToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  stack<int,_std::deque<int,_std::allocator<int>_>_> *__x;
  ifstream *piVar1;
  _Elt_pointer piVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  size_type sVar6;
  long lVar7;
  Token *pTVar8;
  ostream *poVar9;
  bool bVar10;
  ulong uVar11;
  byte bVar12;
  int i;
  int iVar13;
  ulong uVar14;
  char cVar15;
  string *psVar16;
  char c;
  int local_1d4;
  Token token;
  string str;
  long local_130;
  long local_128;
  long local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (this->ungottenToken == true) {
    this->ungottenToken = false;
    Token::Token(__return_storage_ptr__,&this->lastToken);
    return __return_storage_ptr__;
  }
  iVar13 = 0;
  while( true ) {
    local_1d4 = iVar13;
    plVar5 = (long *)std::istream::get((char *)this->inStream);
    if ((((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) ||
        (iVar3 = isspace((int)c), c == '\n')) || (iVar3 == 0)) break;
    iVar13 = iVar13 + 1;
  }
  if (c == '#') {
    do {
      plVar5 = (long *)std::istream::get((char *)this->inStream);
    } while ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0);
  }
  if (((byte)this->inStream[*(long *)(*(long *)this->inStream + -0x18) + 0x20] & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"Error while reading the input stream in Tokenizer.\n");
    goto LAB_0010ce80;
  }
  Token::Token(&token);
  piVar1 = this->inStream;
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 2) != 0) {
    sVar6 = std::deque<int,_std::allocator<int>_>::size(&(this->indents).c);
    if (sVar6 < 2) {
      token._eof = true;
      bVar12 = token._symbol;
    }
    else {
      std::deque<int,_std::allocator<int>_>::pop_back(&(this->indents).c);
      token._ded = true;
      std::istream::unget();
      bVar12 = token._symbol;
    }
    goto LAB_0010cd30;
  }
  bVar12 = token._symbol;
  if (this->parsingANewLine == true) {
    __x = &this->indents;
    piVar2 = (this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar2 == (this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      iVar3 = (this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1][0x7f];
    }
    else {
      iVar3 = piVar2[-1];
    }
    if (iVar3 != iVar13) {
      if (iVar3 < iVar13) {
        std::istream::unget();
        token._wholeNumber = (double)iVar13;
        token._ind = true;
        std::deque<int,_std::allocator<int>_>::push_back(&__x->c,&local_1d4);
        bVar12 = token._symbol;
      }
      else if (iVar13 < iVar3) {
        std::deque<int,_std::allocator<int>_>::deque
                  ((deque<int,_std::allocator<int>_> *)&str,&__x->c);
        while (local_130 !=
               CONCAT71(str.field_2._M_allocated_capacity._1_7_,str.field_2._M_local_buf[0])) {
          lVar7 = local_130;
          if (local_130 == local_128) {
            lVar7 = *(long *)(local_118 + -8) + 0x200;
          }
          if (*(int *)(lVar7 + -4) == iVar13) {
            std::deque<int,_std::allocator<int>_>::pop_back(&__x->c);
            token._ded = true;
            for (; -1 < iVar13; iVar13 = iVar13 + -1) {
              std::istream::unget();
            }
            std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                      ((_Deque_base<int,_std::allocator<int>_> *)&str);
            bVar12 = token._symbol;
            goto LAB_0010cd30;
          }
          std::deque<int,_std::allocator<int>_>::pop_back((deque<int,_std::allocator<int>_> *)&str);
        }
        poVar9 = std::operator<<((ostream *)&std::cout,"BAD DEDENT: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar13);
        std::operator<<(poVar9," spaces.\n");
        goto LAB_0010ce80;
      }
      goto LAB_0010cd30;
    }
  }
  uVar4 = (uint)c;
  if (uVar4 == 10) {
    token._eol = true;
    goto LAB_0010cd30;
  }
  cVar15 = (char)piVar1;
  if (uVar4 - 0x30 < 10) {
    std::istream::putback(cVar15);
    token._wholeNumber = readInteger(this);
    token._isWholeNumber = true;
    bVar12 = token._symbol;
    goto LAB_0010cd30;
  }
  if (c == '!') {
    std::istream::putback(cVar15);
    readRelOp_abi_cxx11_(&local_b0,this);
    Token::setOp(&token,&local_b0);
    psVar16 = &local_b0;
  }
  else if (c == '\"') {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    while( true ) {
      iVar13 = std::istream::peek();
      if (iVar13 == 0x22) break;
      std::istream::get((char *)this->inStream);
      std::__cxx11::string::push_back((char)&str);
    }
    std::istream::get((char *)this->inStream);
    std::__cxx11::string::string((string *)&local_50,(string *)&str);
    psVar16 = &local_50;
    Token::setString(&token,psVar16);
LAB_0010cd21:
    std::__cxx11::string::~string((string *)psVar16);
    psVar16 = &str;
  }
  else if (c == '/') {
    iVar13 = std::istream::peek();
    uVar14 = 0x2f;
    if (iVar13 == 0x2f) {
      str._M_dataplus._M_p = (pointer)&str.field_2;
      str._M_string_length = 0;
      str.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::push_back((char)&str);
      std::istream::get((char *)this->inStream);
      std::__cxx11::string::push_back((char)&str);
      std::__cxx11::string::string((string *)&local_f0,(string *)&str);
      Token::setOp(&token,&local_f0);
      psVar16 = &local_f0;
      goto LAB_0010cd21;
    }
LAB_0010cd91:
    bVar12 = (byte)uVar14;
    uVar11 = uVar14 & 0xff;
    if (bVar12 < 0x3c) {
      if ((0xac2000000000U >> (uVar14 & 0x3f) & 1) != 0) goto LAB_0010cd30;
      if (uVar11 == 0x3a) {
        token._symbol = ':';
        bVar12 = token._symbol;
        goto LAB_0010cd30;
      }
      if (uVar11 == 0x3b) {
        token._symbol = ';';
        bVar12 = token._symbol;
        goto LAB_0010cd30;
      }
    }
    if ((bVar12 & 0xfe) == 0x28) goto LAB_0010cd30;
    if (bVar12 == 0x2c) {
      token._symbol = ',';
      bVar12 = token._symbol;
      goto LAB_0010cd30;
    }
    iVar13 = (int)uVar11;
    if (iVar13 == 0x2e) {
      token._symbol = '.';
      bVar12 = token._symbol;
      goto LAB_0010cd30;
    }
    if (((iVar13 == 0x5b) || (iVar13 == 0x5d)) || ((iVar13 == 0x7d || (iVar13 == 0x7b))))
    goto LAB_0010cd30;
    iVar13 = isalpha((int)c);
    if (iVar13 == 0) {
      poVar9 = std::operator<<((ostream *)&std::cout,"Unknown character in input. ->");
      poVar9 = std::operator<<(poVar9,c);
      poVar9 = std::operator<<(poVar9,"<-");
      std::endl<char,std::char_traits<char>>(poVar9);
LAB_0010ce80:
      exit(1);
    }
    std::istream::putback((char)this->inStream);
    readName_abi_cxx11_(&local_110,this);
    std::__cxx11::string::_M_assign((string *)&token);
    psVar16 = &local_110;
  }
  else if (c == '<') {
    std::istream::putback(cVar15);
    readRelOp_abi_cxx11_(&local_90,this);
    Token::setOp(&token,&local_90);
    psVar16 = &local_90;
  }
  else if (c == '=') {
    iVar13 = std::istream::peek();
    if (iVar13 != 0x3d) {
      token._symbol = c;
      bVar12 = token._symbol;
      goto LAB_0010cd30;
    }
    std::istream::putback((char)this->inStream);
    readRelOp_abi_cxx11_(&local_d0,this);
    Token::setOp(&token,&local_d0);
    psVar16 = &local_d0;
  }
  else {
    uVar14 = (ulong)uVar4;
    if (c != '>') goto LAB_0010cd91;
    std::istream::putback(cVar15);
    readRelOp_abi_cxx11_(&local_70,this);
    Token::setOp(&token,&local_70);
    psVar16 = &local_70;
  }
  std::__cxx11::string::~string((string *)psVar16);
  bVar12 = token._symbol;
LAB_0010cd30:
  token._symbol = bVar12;
  bVar10 = true;
  if (token._eol == false) {
    bVar10 = token._ded;
  }
  this->parsingANewLine = bVar10;
  std::vector<Token,_std::allocator<Token>_>::push_back(&this->_tokens,&token);
  pTVar8 = Token::operator=(&this->lastToken,&token);
  Token::Token(__return_storage_ptr__,pTVar8);
  Token::~Token(&token);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::getToken() {

    if (ungottenToken) {
        ungottenToken = false;
        return lastToken;
    }

    char c;
    int spaces = 0;
    while( inStream.get(c) && isspace(c) && c != '\n' )  // Skip spaces but not new-line chars.
        spaces++;

    if (c == '#') while (inStream.get(c) && c != '\n');  // Skip spaces and new-line chars.;

    if(inStream.bad()) {
        std::cout << "Error while reading the input stream in Tokenizer.\n";
        exit(1);
    }


    Token token;

    if (inStream.eof()) {
        if(indents.size() > 1){
            indents.pop();
            token.isDedent() = true;
            inStream.unget();
        } else token.eof() = true;
    } else if(parsingANewLine && spaces != indents.top()){ //Indent Handling
        if (spaces > indents.top()) {
            inStream.unget();
            token.setIndent(spaces);
            indents.push(spaces);
        } else if (spaces < indents.top()) {
            std::stack<int>indentsCopy = indents;
            while(!indentsCopy.empty()){
                if(spaces == indentsCopy.top())
                    break;
                indentsCopy.pop();
            }
            if(indentsCopy.empty()){
                std::cout << "BAD DEDENT: " << spaces << " spaces.\n";
                exit(1);
            } else {
                indents.pop();
                token.isDedent() = true;
                for (int i = spaces; i >= 0; i--)
                    inStream.unget();
            }
        }
    }
//    else if (spaces > indents.top() && parsingANewLine) {
//        indents.push(spaces);
//        inStream.putback(c);
//        token.isIndent() = true;
//        parsingANewLine = false;
//    } else if (spaces < indents.top() && parsingANewLine && c != '\n') {
//        while (!indents.empty()) {
//            indents.pop();
//            dedents++;
//            if(indents.top() == spaces)
//                break;
//
//        }
//        if (indents.empty()) {
//            std::cout << "Indentation error..." << std::endl;
//            exit(2);
//        }
//        inStream.putback(c);
//        token.isDedent() = true;
//        parsingANewLine = false;
//    }
    else if (c == '\n') {  // will not ever be the case unless new-line characters are not supressed.
        //parsingANewLine = true;
        token.eol() = true;
    } else if (isdigit(c)) { // a integer?
        // put the digit back into the input stream so
        // we read the entire number in a function
        inStream.putback(c);
        token.setWholeNumber(readInteger());
        //parsingANewLine = false;
    } else if (c == '>') {
        inStream.putback(c);
        token.setOp(readRelOp());
    } else if (c == '<') {
        inStream.putback(c);
        token.setOp(readRelOp());
    } else if (c == '!') {
        inStream.putback(c);
        token.setOp(readRelOp());
    } else if (c == '=') {
        if (inStream.peek() == '=') {
            inStream.putback(c);
            token.setOp(readRelOp());

        } else token.symbol(c);
    } else if (c == '"') {
        std::string str;
        while (inStream.peek() != '"') {
            inStream.get(c);
            str += c;
        }
        inStream.get(c);
        token.setString(str);

    } else if ((c == '/') && (inStream.peek() == '/')) {
        std::string str;
        str += c;
        inStream.get(c);
        str += c;
        token.setOp(str);
    } else if (c == '+' || c == '-' || c == '*' || c == '/' || c == '%') token.symbol(c);
    else if (c == ';') token.symbol(c);
    else if (c == ':') token.symbol(c);
    else if (c == '(' || c == ')') token.symbol(c);
    else if (c == '{' || c == '}') token.symbol(c);
    else if (c == '[' || c == ']') token.symbol(c);
    else if (c == ',') token.symbol(c);
    else if (c == '.') token.symbol(c);
    else if (isalpha(c)) {  // an identifier?
        // put c back into the stream so we can read the entire name in a function.
        inStream.putback(c);
        token.setName(readName());
        //parsingANewLine = false;
    } else {
        std::cout << "Unknown character in input. ->" << c << "<-" << std::endl;
        exit(1);
    }
    parsingANewLine = token.eol() || token.isDedent();


    _tokens.push_back(token);
    return lastToken = token;
}